

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

KOption getdetails(Header *h,size_t totalsize,char **fmt,int *psize,int *ntoalign)

{
  KOption KVar1;
  uint local_38;
  KOption local_34;
  int align;
  KOption opt;
  int *ntoalign_local;
  int *psize_local;
  char **fmt_local;
  size_t totalsize_local;
  Header *h_local;
  
  _align = (uint *)ntoalign;
  ntoalign_local = psize;
  psize_local = (int *)fmt;
  fmt_local = (char **)totalsize;
  totalsize_local = (size_t)h;
  local_34 = getoption(h,fmt,psize);
  local_38 = *ntoalign_local;
  if ((local_34 == Kpaddalign) &&
     (((**(char **)psize_local == '\0' ||
       (KVar1 = getoption((Header *)totalsize_local,(char **)psize_local,(int *)&local_38),
       KVar1 == Kchar)) || (local_38 == 0)))) {
    luaL_argerror(*(lua_State **)totalsize_local,1,"invalid next option for option \'X\'");
  }
  if (((int)local_38 < 2) || (local_34 == Kchar)) {
    *_align = 0;
  }
  else {
    if (*(int *)(totalsize_local + 0xc) < (int)local_38) {
      local_38 = *(uint *)(totalsize_local + 0xc);
    }
    if ((local_38 & local_38 - 1) != 0) {
      luaL_argerror(*(lua_State **)totalsize_local,1,"format asks for alignment not power of 2");
    }
    *_align = local_38 - ((uint)fmt_local & local_38 - 1) & local_38 - 1;
  }
  return local_34;
}

Assistant:

static KOption getdetails(Header *h, size_t totalsize,
                          const char **fmt, int *psize, int *ntoalign) {
    KOption opt = getoption(h, fmt, psize);
    int align = *psize;  /* usually, alignment follows size */
    if (opt == Kpaddalign) {  /* 'X' gets alignment from following option */
        if (**fmt == '\0' || getoption(h, fmt, &align) == Kchar || align == 0)
            luaL_argerror(h->L, 1, "invalid next option for option 'X'");
    }
    if (align <= 1 || opt == Kchar)  /* need no alignment? */
        *ntoalign = 0;
    else {
        if (align > h->maxalign)  /* enforce maximum alignment */
            align = h->maxalign;
        if ((align & (align - 1)) != 0)  /* is 'align' not a power of 2? */
            luaL_argerror(h->L, 1, "format asks for alignment not power of 2");
        *ntoalign = (align - (int) (totalsize & (align - 1))) & (align - 1);
    }
    return opt;
}